

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O3

string * highsBoolToString_abi_cxx11_(string *__return_storage_ptr__,bool b,HighsInt field_width)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  uVar1 = -field_width;
  if (0 < field_width) {
    uVar1 = field_width;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (uVar1 < 2) {
    pcVar2 = "F";
    if (b) {
      pcVar2 = "T";
    }
    pcVar3 = "";
    pcVar4 = "";
  }
  else {
    if (uVar1 == 2) {
      pcVar2 = "false";
      if (b) {
        pcVar2 = "true";
      }
      pcVar4 = pcVar2 + ((ulong)b ^ 5);
      goto LAB_001f311e;
    }
    if (field_width < 0) {
      pcVar2 = "false";
      if (b) {
        pcVar2 = "true ";
      }
      pcVar3 = "true ";
    }
    else {
      pcVar2 = "false";
      if (b) {
        pcVar2 = " true";
      }
      pcVar3 = " true";
    }
    pcVar3 = pcVar3 + 5;
    pcVar4 = "";
  }
  if (b) {
    pcVar4 = pcVar3;
  }
LAB_001f311e:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

const std::string highsBoolToString(const bool b, const HighsInt field_width) {
  const HighsInt abs_field_width = std::abs(field_width);
  if (abs_field_width <= 1) return b ? "T" : "F";
  if (abs_field_width <= 2) return b ? "true" : "false";
  if (field_width < 0) return b ? "true " : "false";
  return b ? " true" : "false";
}